

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayTests.cpp
# Opt level: O0

void __thiscall Array2dTest_Access_Test::Array2dTest_Access_Test(Array2dTest_Access_Test *this)

{
  undefined8 *in_RDI;
  Test *unaff_retaddr;
  
  testing::Test::Test(unaff_retaddr);
  *in_RDI = &PTR__Array2dTest_Access_Test_002b1238;
  return;
}

Assistant:

TEST(Array2dTest, Access)
{
    Array2d<int> a(3, 5, -1);
    for (int i = 0; i < 3; i++)
    for (int j = 0; j < 5; j++)
        a(i, j) = i + j;
    for (int i = 0; i < 3; i++)
        for (int j = 0; j < 5; j++)
        ASSERT_EQ(i + j, a(i, j));
}